

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O2

void __thiscall
ktxValidator::logger::addIssue<char_const*,int>
          (logger *this,severity severity,issue *issue,char *args,int args_1)

{
  ostream *poVar1;
  size_type sVar2;
  fatal *this_00;
  int iVar3;
  uint uVar4;
  pointer_____offset_0x10___ *ppuVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  uint local_204;
  string message;
  stringstream oss;
  
  if (this->quiet == true) {
    if (severity == eWarning) {
      this->warningCount = this->warningCount + 1;
      return;
    }
    if (severity == eError) {
      this->errorCount = this->errorCount + 1;
      return;
    }
  }
  else {
    if (this->headerWritten == false) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Issues in: ");
      poVar1 = std::operator<<(poVar1,(string *)&this->nameOfFileBeingValidated);
      std::endl<char,std::char_traits<char>>(poVar1);
      this->headerWritten = true;
    }
    if (this->maxIssues <= this->warningCount + this->errorCount) {
      this_00 = (fatal *)__cxa_allocate_exception(0x10);
      max_issues_exceeded::max_issues_exceeded((max_issues_exceeded *)this_00);
      ppuVar5 = &max_issues_exceeded::typeinfo;
      goto LAB_001134b7;
    }
    iVar3 = 4;
    while (bVar9 = iVar3 != 0, iVar3 = iVar3 + -1, bVar9) {
      std::ostream::put(-0x48);
    }
    if (severity == eWarning) {
      std::operator<<((ostream *)&std::cout,"WARNING: ");
      this->warningCount = this->warningCount + 1;
      local_204 = 0xd;
    }
    else if (severity == eError) {
      std::operator<<((ostream *)&std::cout,"ERROR: ");
      this->errorCount = this->errorCount + 1;
      local_204 = 0xb;
    }
    else {
      local_204 = 0;
      if (severity == eFatal) {
        std::operator<<((ostream *)&std::cout,"FATAL: ");
        local_204 = 0xb;
      }
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&oss);
    sprintf<char_const*,int>(&oss,&issue->message,args,args_1);
    std::__cxx11::stringbuf::str();
    iVar3 = 0;
    uVar7 = 0;
    for (sVar2 = message._M_string_length; 0x50 < local_204 + sVar2; sVar2 = sVar2 - uVar6) {
      uVar8 = uVar7 + (0x51 - local_204);
      uVar6 = 0x50 - local_204;
      do {
        uVar4 = uVar8 - 2;
        uVar8 = uVar8 - 1;
        uVar6 = uVar6 - 1;
      } while (message._M_dataplus._M_p[uVar4] != ' ');
      uVar4 = local_204;
      if (iVar3 != 0) {
        while (uVar4 != 0) {
          std::ostream::put(-0x48);
          uVar4 = uVar4 - 1;
        }
      }
      poVar1 = (ostream *)
               std::ostream::write((char *)&std::cout,(long)(message._M_dataplus._M_p + uVar7));
      std::endl<char,std::char_traits<char>>(poVar1);
      iVar3 = iVar3 + 1;
      uVar7 = uVar8;
    }
    if (iVar3 != 0) {
      iVar3 = 4;
      while (bVar9 = iVar3 != 0, iVar3 = iVar3 + -1, bVar9) {
        std::ostream::put(-0x48);
      }
    }
    std::ostream::write((char *)&std::cout,(long)(message._M_dataplus._M_p + uVar7));
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::stringstream::~stringstream((stringstream *)&oss);
  }
  if (severity != eFatal) {
    return;
  }
  this_00 = (fatal *)__cxa_allocate_exception(0x10);
  fatal::fatal(this_00);
  ppuVar5 = &fatal::typeinfo;
LAB_001134b7:
  __cxa_throw(this_00,ppuVar5,std::runtime_error::~runtime_error);
}

Assistant:

void
ktxValidator::logger::addIssue(severity severity, issue issue, Args ... args)
{
    if (quiet) {
        switch (severity) {
          case eError:
            errorCount++;
            break;
          case eFatal:
            break;
          case eWarning:
            warningCount++;
            break;
        }
    } else {
        if (!headerWritten) {
            cout << "Issues in: " << nameOfFileBeingValidated << std::endl;
            headerWritten = true;
        }
        const uint32_t baseIndent = 4;
        uint32_t indent = 0;
        if ((errorCount + warningCount ) < maxIssues) {
            for (uint32_t j = 0; j < baseIndent; j++)
              cout.put(' ');
            switch (severity) {
              case eError:
                cout << "ERROR: ";
                indent = baseIndent + 7;
                errorCount++;
                break;
              case eFatal:
                cout << "FATAL: ";
                indent = baseIndent + 7;
                break;
              case eWarning:
                cout << "WARNING: ";
                indent = baseIndent + 9;
                warningCount++;
                break;
            }
            //fprintf(stdout, issue.message.c_str(), args...);
            std::stringstream oss;
            sprintf(oss, issue.message, args...);
            // Wrap lines on spaces.
            std::string message = oss.str();
            size_t nchars = message.size();
            uint32_t line = 0;
            uint32_t lsi = 0;  // line start index.
            uint32_t lei; // line end index
            while (nchars + indent > 80) {
                uint32_t ll; // line length
                lei = lsi + 79 - indent;
                while (message[lei] != ' ') lei--;
                ll = lei - lsi;
                for (uint32_t j = 0; j < (line ? indent : 0); j++) {
                    cout.put(' ');
                }
                cout.write(&message[lsi], ll) << std::endl;
                lsi = lei + 1; // +1 to skip the space
                nchars -= ll;
                line++;
            }
            for (uint32_t j = 0; j < (line ? baseIndent : 0); j++) {
                cout.put(' ');
            }
            cout.write(&message[lsi], nchars);
            cout << std::endl;
        } else {
            throw max_issues_exceeded();
        }
    }
    if (severity == eFatal)
        throw fatal();
}